

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  float fVar3;
  float fVar4;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  fVar3 = (this->Pos).x;
  fVar4 = (this->Pos).y;
  local_18 = (int)((r_abs->Min).x - fVar3);
  iStack_14 = (int)((r_abs->Min).y - fVar4);
  iStack_10 = (int)((r_abs->Max).x - fVar3);
  iStack_c = (int)((r_abs->Max).y - fVar4);
  IVar2 = ImHash(&local_18,0x10,(this->IDStack).Data[(long)(this->IDStack).Size + -1]);
  pIVar1 = GImGui;
  if (GImGui->ActiveId == IVar2) {
    GImGui->ActiveIdIsAlive = IVar2;
  }
  if (pIVar1->ActiveIdPreviousFrame == IVar2) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  return IVar2;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}